

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdpc.c
# Opt level: O3

void hdpc_generate_mat_specexact(m256v *H,parameters *P)

{
  long lVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint8_t *memory;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  m256v MT;
  m256v GAMMA;
  m256v I_H;
  m256v G_HDPC;
  m256v mStack_98;
  uint8_t *local_80;
  m256v local_78;
  m256v local_60;
  m256v local_48;
  
  iVar6 = P->S + P->Kprime;
  iVar5 = P->H;
  local_80 = (uint8_t *)malloc((long)(iVar6 * iVar5));
  m256v_make(&mStack_98,iVar5,iVar6,local_80);
  m256v_clear(&mStack_98);
  iVar5 = P->Kprime;
  iVar6 = P->S;
  if (0 < iVar5 + iVar6 + -1) {
    lVar9 = 0;
    do {
      lVar1 = lVar9 + 1;
      uVar3 = Rand((uint32_t)lVar1,6,P->H);
      uVar4 = Rand((uint32_t)lVar1,7,P->H + -1);
      uVar7 = P->H;
      mStack_98.e[lVar9 + (long)(int)uVar3 * mStack_98.rstride] = '\x01';
      mStack_98.e[lVar9 + (long)(int)((uVar4 + uVar3 + 1) % uVar7) * mStack_98.rstride] = '\x01';
      iVar5 = P->Kprime;
      iVar6 = P->S;
      lVar9 = lVar1;
    } while (lVar1 < iVar5 + iVar6 + -1);
  }
  if (0 < P->H) {
    uVar2 = '\x01';
    lVar9 = 0;
    do {
      mStack_98.e[(long)P->S + (long)P->Kprime + mStack_98.rstride * lVar9 + -1] = uVar2;
      uVar2 = gf256_mul(uVar2,'\x02');
      lVar9 = lVar9 + 1;
    } while (lVar9 < P->H);
    iVar5 = P->Kprime;
    iVar6 = P->S;
  }
  uVar7 = iVar6 + iVar5;
  memory = (uint8_t *)malloc((ulong)(uVar7 * uVar7));
  m256v_make(&local_78,uVar7,uVar7,memory);
  m256v_clear(&local_78);
  if (0 < (int)uVar7) {
    uVar2 = '\x01';
    uVar8 = 0;
    do {
      lVar9 = 0;
      do {
        local_78.e[lVar9 + (lVar9 + uVar8) * local_78.rstride] = uVar2;
        lVar1 = lVar9 + uVar8;
        lVar9 = lVar9 + 1;
      } while (lVar1 + 1U < (ulong)uVar7);
      uVar2 = gf256_mul(uVar2,'\x02');
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar7);
  }
  m256v_get_subview(&local_48,H,0,0,P->H,P->S + P->Kprime);
  m256v_mul(&mStack_98,&local_78,&local_48);
  m256v_get_subview(&local_60,H,0,P->S + P->Kprime,P->H,P->H);
  m256v_clear(&local_60);
  if (0 < P->H) {
    lVar9 = 0;
    do {
      local_60.e[lVar9 + local_60.rstride * lVar9] = '\x01';
      lVar9 = lVar9 + 1;
    } while (lVar9 < P->H);
  }
  free(memory);
  free(local_80);
  return;
}

Assistant:

void hdpc_generate_mat_specexact(m256v* H, const parameters* P)
{
	assert(H->n_row == P->H);
	assert(H->n_col == P->L);

	/* Create the MT matrix */
	uint8_t* mt = malloc(P->H * (P->Kprime + P->S));
	m256v MT = m256v_make(P->H, P->Kprime + P->S, mt);
	m256v_clear(&MT);
	for (int j = 0; j < P->Kprime + P->S - 1; ++j) {
		uint32_t a = Rand(j + 1, 6, P->H);
		uint32_t b = (a + Rand(j + 1, 7, P->H - 1) + 1) % P->H;
		m256v_set_el(&MT, a, j, 1);
		m256v_set_el(&MT, b, j, 1);
	}
	uint8_t val = 1;
	for (int j = 0; j < P->H; ++j) {
		m256v_set_el(&MT, j, P->Kprime + P->S - 1, val);
		val = gf256_mul(val, 2);
	}

	/* Create the GAMMA matrix */
	const int d = P->Kprime + P->S;
	uint8_t* gamma = malloc(d * d);
	m256v GAMMA = m256v_make(d, d, gamma);
	m256v_clear(&GAMMA);

	val = 1;
	for (int i = 0; i < d; ++i) {
		for (int j = i; j < d; ++j) {
			m256v_set_el(&GAMMA, j, j - i, val);
		}
		val = gf256_mul(val, 2);
	}

	/* Place the product MT * GAMMA into the G_HDPC matrix */
	m256v G_HDPC = m256v_get_subview(H, 0, 0, P->H, P->Kprime + P->S);
	m256v_mul(&MT, &GAMMA, &G_HDPC);

	/* Write the diagonal matrix I_H */
	m256v I_H = m256v_get_subview(H, 0, P->Kprime + P->S, P->H, P->H);
	m256v_clear(&I_H);
	for (int i = 0; i < P->H; ++i) {
		m256v_set_el(&I_H, i, i, 1);
	}

	/* Free temp space */
	free(gamma);
	free(mt);
}